

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdcSpfd.c
# Opt level: O3

int Bdc_SpfdMark1(Bdc_Ent_t *p,Bdc_Ent_t *pEnt)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar4 = *(ulong *)pEnt;
  uVar3 = uVar4 & 0x1fffffff;
  iVar2 = 0;
  if (-1 < (long)uVar4 && uVar3 != 0x1fffffff) {
    iVar2 = 0;
    do {
      *(ulong *)pEnt = uVar4 | 0x8000000000000000;
      iVar1 = Bdc_SpfdMark1(p,p + uVar3);
      uVar3 = (ulong)*(uint *)&pEnt->field_0x4 & 0x1fffffff;
      iVar2 = iVar1 + ((uint)(uVar4 >> 0x1f) & 1) + iVar2;
      uVar4 = *(ulong *)(p + uVar3);
      if ((long)uVar4 < 0) {
        return iVar2;
      }
      pEnt = p + uVar3;
      uVar3 = uVar4 & 0x1fffffff;
    } while ((int)uVar3 != 0x1fffffff);
  }
  return iVar2;
}

Assistant:

int Bdc_SpfdMark1( Bdc_Ent_t * p, Bdc_Ent_t * pEnt )
{
    if ( pEnt->iFan0 == BDC_TERM )
        return 0;
    if ( pEnt->fMark1 )
        return 0;
    pEnt->fMark1 = 1;
    return pEnt->fMark0 + 
        Bdc_SpfdMark1(p, p + pEnt->iFan0) + 
        Bdc_SpfdMark1(p, p + pEnt->iFan1);
}